

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

void __thiscall llvm::StringMapImpl::StringMapImpl(StringMapImpl *this,StringMapImpl *RHS)

{
  StringMapImpl *RHS_local;
  StringMapImpl *this_local;
  
  this->TheTable = RHS->TheTable;
  this->NumBuckets = RHS->NumBuckets;
  this->NumItems = RHS->NumItems;
  this->NumTombstones = RHS->NumTombstones;
  this->ItemSize = RHS->ItemSize;
  RHS->TheTable = (StringMapEntryBase **)0x0;
  RHS->NumBuckets = 0;
  RHS->NumItems = 0;
  RHS->NumTombstones = 0;
  return;
}

Assistant:

StringMapImpl(StringMapImpl &&RHS)
      : TheTable(RHS.TheTable), NumBuckets(RHS.NumBuckets),
        NumItems(RHS.NumItems), NumTombstones(RHS.NumTombstones),
        ItemSize(RHS.ItemSize) {
    RHS.TheTable = nullptr;
    RHS.NumBuckets = 0;
    RHS.NumItems = 0;
    RHS.NumTombstones = 0;
  }